

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O1

errr Term_putstr(wchar_t x,wchar_t y,wchar_t n,wchar_t a,char *s)

{
  term_win *ptVar1;
  errr eVar2;
  
  if (Term == (term *)0x0) {
    return 0;
  }
  if ((((L'\xffffffff' < x) && (x < Term->wid)) && (L'\xffffffff' < y)) && (y < Term->hgt)) {
    ptVar1 = Term->scr;
    ptVar1->cx = x;
    ptVar1->cy = y;
    ptVar1->cu = false;
    eVar2 = Term_addstr(n,a,s);
    return eVar2;
  }
  return -1;
}

Assistant:

errr Term_putstr(int x, int y, int n, int a, const char *s)
{
	errr res;

	if (!Term)
		return 0;

	/* Move first */
	if ((res = Term_gotoxy(x, y)) != 0) return (res);

	/* Then add the string */
	if ((res = Term_addstr(n, a, s)) != 0) return (res);

	/* Success */
	return (0);
}